

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetDeadReckoningParameterFlag(TSPI_PDU *this,KBOOL F)

{
  KBOOL F_local;
  TSPI_PDU *this_local;
  
  if (F != (KBOOL)((this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1)) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xef | F << 4;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 7;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 7;
    }
  }
  return;
}

Assistant:

void TSPI_PDU::SetDeadReckoningParameterFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8DRM )return;

    m_TSPIFlagUnion.m_ui8DRM = F;

    if( F )
    {
        m_ui16PDULength += LE_DeadReckoningParameter::LE_DEAD_RECKONING_PARAMETER_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_DeadReckoningParameter::LE_DEAD_RECKONING_PARAMETER_SIZE;
    }
}